

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  double t152;
  double t151;
  double t150;
  double t148;
  double t147;
  double t146;
  double t142;
  double t141;
  double t138;
  double t134;
  double t133;
  double t132;
  double t131;
  double t129;
  double t127;
  double t125;
  double t124;
  double t123;
  double t122;
  double t121;
  double t119;
  double t118;
  double t112;
  double t108;
  double t106;
  double t105;
  double t103;
  double t101;
  double t100;
  double t99;
  double t98;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t85;
  double t84;
  double t83;
  double t80;
  double t75;
  double t71;
  double t70;
  double t67;
  double t62;
  double t60;
  double t59;
  double t55;
  double t54;
  double t53;
  double t52;
  double t51;
  double t50;
  double t49;
  double t48;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t42;
  double t41;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t31;
  double t30;
  double t27;
  double t25;
  double t22;
  double t17;
  double t14;
  double t13;
  double t11;
  double t8;
  double t7;
  double t143;
  double t137;
  double t136;
  double t135;
  double t130;
  double t116;
  double t115;
  double t111;
  double t110;
  double t21;
  double t20;
  double t19;
  double t6;
  double t4;
  double t56;
  double t5;
  double t3;
  double t1;
  double in_stack_fffffffffffffc70;
  double dVar12;
  
  dVar1 = in_XMM0_Qa + in_XMM1_Qa;
  dVar2 = safe_math::cbrt<double>(9.15161254251262e-318);
  dVar2 = 2.4814019635975995 / dVar2;
  safe_math::sqrt<double>(9.15211154881492e-318);
  pow_3_2<double>(in_stack_fffffffffffffc70);
  dVar3 = safe_math::log<double>(9.15331212833431e-318);
  dVar3 = (dVar2 * 0.053425 + 1.0) * 0.0621814 * dVar3;
  dVar4 = in_XMM0_Qa - in_XMM1_Qa;
  dVar5 = dVar4 * (1.0 / dVar1);
  dVar6 = dVar5 + 1.0;
  dVar12 = 1e-15;
  dVar11 = (double)(-(ulong)(dVar6 <= 1e-15) & 0x3ff0000000000000);
  dVar7 = safe_math::cbrt<double>(9.15510064597226e-318);
  dVar8 = dVar7 * dVar12;
  dVar9 = safe_math::cbrt<double>(9.15535261945164e-318);
  dVar6 = piecewise_functor_3<double>((bool)(-(dVar11 != 0.0) & 1),dVar8,dVar9 * dVar6);
  dVar5 = 1.0 - dVar5;
  dVar12 = (double)(-(ulong)(dVar5 <= dVar12) & 0x3ff0000000000000);
  dVar10 = safe_math::cbrt<double>(9.15625181892707e-318);
  dVar8 = piecewise_functor_3<double>(dVar12 != 0.0,dVar8,dVar10 * dVar5);
  dVar6 = ((dVar6 + dVar8) - 2.0) * 1.9236610509315362;
  dVar8 = safe_math::log<double>(9.15810456509897e-318);
  dVar5 = safe_math::log<double>(9.15911245901649e-318);
  dVar5 = (dVar2 * 0.0278125 + 1.0) * dVar5;
  dVar11 = piecewise_functor_3<double>(dVar11 != 0.0,dVar7 * dVar7,dVar9 * dVar9);
  dVar7 = piecewise_functor_3<double>(dVar12 != 0.0,dVar7 * dVar7,dVar10 * dVar10);
  dVar11 = dVar11 / 2.0 + dVar7 / 2.0;
  safe_math::exp<double>(9.16333672028843e-318);
  dVar7 = safe_math::log<double>(9.16598491215014e-318);
  *in_RDI = -dVar3 + dVar4 * dVar4 * dVar4 * dVar4 * (1.0 / (dVar1 * dVar1 * dVar1 * dVar1)) *
                     dVar6 * (dVar5 * -0.0197516734986138 +
                             (dVar2 * 0.05137 + 1.0) * -0.0310907 * dVar8 + dVar3) +
            dVar6 * 0.0197516734986138 * dVar5 +
            dVar11 * dVar11 * dVar11 * 0.031090690869654894 * dVar7;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t56 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t19 = t1 * t1;
    constexpr double t20 = t3 * t3;
    constexpr double t21 = t19 * t20;
    constexpr double t110 = 0.1e1 / t3;
    constexpr double t111 = t110 * t5;
    constexpr double t115 = BB * beta;
    constexpr double t116 = 0.1e1 / gamma;
    constexpr double t130 = t56 * t56;
    constexpr double t135 = 0.1e1 / t20;
    constexpr double t136 = t1 * t135;
    constexpr double t137 = t136 * t6;
    constexpr double t143 = beta * t116;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t11 = t4 * t6 / t8;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t17 = pow_3_2( t11 );
    const double t22 = t8 * t8;
    const double t25 = t21 * t5 / t22;
    const double t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = rho_a - rho_b;
    const double t35 = t34 * t34;
    const double t36 = t35 * t35;
    const double t37 = t7 * t7;
    const double t38 = t37 * t37;
    const double t39 = 0.1e1 / t38;
    const double t40 = t36 * t39;
    const double t41 = 0.1e1 / t7;
    const double t42 = t34 * t41;
    const double t43 = 0.1e1 + t42;
    const double t44 = t43 <= zeta_tol;
    const double t45 = safe_math::cbrt( zeta_tol );
    const double t46 = t45 * zeta_tol;
    const double t47 = safe_math::cbrt( t43 );
    const double t48 = t47 * t43;
    const double t49 = piecewise_functor_3( t44, t46, t48 );
    const double t50 = 0.1e1 - t42;
    const double t51 = t50 <= zeta_tol;
    const double t52 = safe_math::cbrt( t50 );
    const double t53 = t52 * t50;
    const double t54 = piecewise_functor_3( t51, t46, t53 );
    const double t55 = t49 + t54 - 0.2e1;
    const double t59 = 0.1e1 / ( 0.2e1 * t56 - 0.2e1 );
    const double t60 = t55 * t59;
    const double t62 = 0.1e1 + 0.5137e-1 * t11;
    const double t67 = 0.705945e1 * t14 + 0.1549425e1 * t11 + 0.420775e0 * t17 + 0.1562925e0 * t25;
    const double t70 = 0.1e1 + 0.32163958997385070134e2 / t67;
    const double t71 = safe_math::log( t70 );
    const double t75 = 0.1e1 + 0.278125e-1 * t11;
    const double t80 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
    const double t83 = 0.1e1 + 0.29608749977793437516e2 / t80;
    const double t84 = safe_math::log( t83 );
    const double t85 = t75 * t84;
    const double t87 = -0.310907e-1 * t62 * t71 + t33 - 0.19751673498613801407e-1 * t85;
    const double t88 = t60 * t87;
    const double t89 = t40 * t88;
    const double t91 = 0.19751673498613801407e-1 * t60 * t85;
    const double t92 = t45 * t45;
    const double t93 = t47 * t47;
    const double t94 = piecewise_functor_3( t44, t92, t93 );
    const double t95 = t52 * t52;
    const double t96 = piecewise_functor_3( t51, t92, t95 );
    const double t98 = t94 / 0.2e1 + t96 / 0.2e1;
    const double t99 = t98 * t98;
    const double t100 = t99 * t98;
    const double t101 = gamma * t100;
    const double t103 = sigma_aa + 0.2e1 * sigma_ab + sigma_bb;
    const double t105 = 0.1e1 / t8 / t37;
    const double t106 = t103 * t105;
    const double t108 = 0.1e1 / t99;
    const double t112 = t108 * t19 * t111;
    const double t118 = ( -t33 + t89 + t91 ) * t116;
    const double t119 = 0.1e1 / t100;
    const double t121 = safe_math::exp( -t118 * t119 );
    const double t122 = t121 - 0.1e1;
    const double t123 = 0.1e1 / t122;
    const double t124 = t116 * t123;
    const double t125 = t103 * t103;
    const double t127 = t115 * t124 * t125;
    const double t129 = 0.1e1 / t22 / t38;
    const double t131 = t129 * t130;
    const double t132 = t99 * t99;
    const double t133 = 0.1e1 / t132;
    const double t134 = t131 * t133;
    const double t138 = t134 * t137;
    const double t141 = t106 * t56 * t112 / 0.96e2 + t127 * t138 / 0.3072e4;
    const double t142 = beta * t141;
    const double t146 = t143 * t123 * t141 + 0.1e1;
    const double t147 = 0.1e1 / t146;
    const double t148 = t116 * t147;
    const double t150 = t142 * t148 + 0.1e1;
    const double t151 = safe_math::log( t150 );
    const double t152 = t101 * t151;


    eps = -t33 + t89 + t91 + t152;

  }